

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HandleManager.cpp
# Opt level: O2

vector<helics::GlobalHandle,_std::allocator<helics::GlobalHandle>_> * __thiscall
helics::HandleManager::regexSearch
          (vector<helics::GlobalHandle,_std::allocator<helics::GlobalHandle>_>
           *__return_storage_ptr__,HandleManager *this,string *regexExpression,InterfaceType type)

{
  bool bVar1;
  int iVar2;
  BasicHandleInfo *__x;
  undefined7 in_register_00000009;
  long lVar3;
  long *plVar4;
  string rex;
  regex rgx;
  
  iVar2 = (int)CONCAT71(in_register_00000009,type);
  if (iVar2 == 0x66) {
    lVar3 = 0xf8;
  }
  else if (iVar2 == 0x69) {
    lVar3 = 0xc0;
  }
  else {
    lVar3 = 0x88;
    if (iVar2 == 0x70) {
      lVar3 = 0x50;
    }
  }
  (__return_storage_ptr__->
  super__Vector_base<helics::GlobalHandle,_std::allocator<helics::GlobalHandle>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<helics::GlobalHandle,_std::allocator<helics::GlobalHandle>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<helics::GlobalHandle,_std::allocator<helics::GlobalHandle>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  iVar2 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          compare((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                  regexExpression,0,6,"REGEX:");
  if (iVar2 == 0) {
    CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&rex,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)regexExpression,
               6,0xffffffffffffffff);
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            &rex,"*");
    if (bVar1) {
      CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::assign
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&rex,".*");
    }
    std::__cxx11::basic_regex<char,std::__cxx11::regex_traits<char>>::
    basic_regex<std::char_traits<char>,std::allocator<char>>
              ((basic_regex<char,std::__cxx11::regex_traits<char>> *)&rgx,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&rex,0x10);
    plVar4 = (long *)((long)&(this->handles).
                             super__Deque_base<helics::BasicHandleInfo,_std::allocator<helics::BasicHandleInfo>_>
                             ._M_impl.super__Deque_impl_data._M_start._M_cur + lVar3);
    while (plVar4 = (long *)*plVar4, plVar4 != (long *)0x0) {
      bVar1 = std::regex_match<char,std::__cxx11::regex_traits<char>>((char *)plVar4[2],&rgx,0);
      if (bVar1) {
        __x = getHandleInfo(this,(InterfaceHandle)*(BaseType *)(plVar4 + 3));
        std::vector<helics::GlobalHandle,_std::allocator<helics::GlobalHandle>_>::push_back
                  (__return_storage_ptr__,&__x->handle);
      }
    }
    CLI::std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex
              ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)&rgx);
    std::__cxx11::string::~string((string *)&rex);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<GlobalHandle> HandleManager::regexSearch(const std::string& regexExpression,
                                                     InterfaceType type) const
{
    const auto& imap = getMap(type);
    std::vector<GlobalHandle> matches;
    if (regexExpression.compare(0, 6, "REGEX:") != 0) {
        return matches;
    }

    std::string rex = regexExpression.substr(6);
    if (rex == "*") {
        rex = ".*";
    }
    try {
        const std::regex rgx(rex);
        for (const auto& mres : imap) {
            if (std::regex_match(mres.first.data(), rgx)) {
                const auto* handle = getHandleInfo(mres.second);
                matches.push_back(handle->handle);
            }
        }
    }
    catch (const std::regex_error& re) {
        throw std::invalid_argument(re.what());
    }
    return matches;
}